

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O3

QString * __thiscall QString::left(QString *__return_storage_ptr__,QString *this,qsizetype n)

{
  ulong uVar1;
  Data *pDVar2;
  
  uVar1 = (this->d).size;
  if ((ulong)n < uVar1) {
    QString(__return_storage_ptr__,(QChar *)(this->d).ptr,n);
  }
  else {
    pDVar2 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = uVar1;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::left(qsizetype n) const
{
    if (size_t(n) >= size_t(size()))
        return *this;
    return QString((const QChar*) d.data(), n);
}